

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromPla(char **pPlas,int nInputs,int nOutputs)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  int local_a8;
  int local_a4;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtkAig;
  Abc_Ntk_t *pNtkSop;
  Fxu_Data_t *p;
  Fxu_Data_t Params;
  int nOutputs_local;
  int nInputs_local;
  char **pPlas_local;
  
  Params.nNodesOld = nOutputs;
  Params.nNodesNew = nInputs;
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Extra_FileNameGeneric("pla");
  pNtk->pName = pcVar2;
  for (local_a4 = 0; local_a4 < Params.nNodesNew; local_a4 = local_a4 + 1) {
    Abc_NtkCreatePi(pNtk);
  }
  for (local_a4 = 0; local_a4 < Params.nNodesOld; local_a4 = local_a4 + 1) {
    Abc_NtkCreatePo(pNtk);
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  local_a4 = 0;
  while( true ) {
    if (Params.nNodesOld <= local_a4) {
      iVar1 = Abc_NtkCheck(pNtk);
      if (iVar1 == 0) {
        fprintf(_stdout,"Abc_NtkFromPla(): Network check has failed.\n");
      }
      Abc_NtkSetDefaultFxParams((Fxu_Data_t *)&p);
      Abc_NtkFastExtract(pNtk,(Fxu_Data_t *)&p);
      Abc_NtkFxuFreeInfo((Fxu_Data_t *)&p);
      pAVar4 = Abc_NtkStrash(pNtk,0,1,0);
      Abc_NtkDelete(pNtk);
      return pAVar4;
    }
    pObj = Abc_NtkCreateNode(pNtk);
    for (local_a8 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_a8 < iVar1; local_a8 = local_a8 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,local_a8);
      Abc_ObjAddFanin(pObj,pAVar3);
    }
    pcVar2 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pPlas[local_a4]);
    (pObj->field_5).pData = pcVar2;
    pAVar3 = Abc_NtkPo(pNtk,local_a4);
    Abc_ObjAddFanin(pAVar3,pObj);
    iVar1 = Abc_SopGetVarNum((char *)(pObj->field_5).pData);
    if (iVar1 != Params.nNodesNew) break;
    local_a4 = local_a4 + 1;
  }
  __assert_fail("Abc_SopGetVarNum((char*)pNode->pData) == nInputs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                ,0xac2,"Abc_Ntk_t *Abc_NtkFromPla(char **, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromPla( char ** pPlas, int nInputs, int nOutputs )
{
    Fxu_Data_t Params, * p = &Params;
    Abc_Ntk_t * pNtkSop, * pNtkAig; 
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    // allocate logic network with SOP local functions
    pNtkSop = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtkSop->pName = Extra_FileNameGeneric("pla");
    // create primary inputs/outputs
    for ( i = 0; i < nInputs; i++ )
        Abc_NtkCreatePi( pNtkSop );
    for ( i = 0; i < nOutputs; i++ )
        Abc_NtkCreatePo( pNtkSop );
    Abc_NtkAddDummyPiNames( pNtkSop );
    Abc_NtkAddDummyPoNames( pNtkSop );
    // create internal nodes
    for ( i = 0; i < nOutputs; i++ )
    {
        pNode = Abc_NtkCreateNode( pNtkSop );
        Abc_NtkForEachPi( pNtkSop, pFanin, k )
            Abc_ObjAddFanin( pNode, pFanin );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkSop->pManFunc, pPlas[i] );
        Abc_ObjAddFanin( Abc_NtkPo(pNtkSop, i), pNode );
        // check that the number of inputs is the same
        assert( Abc_SopGetVarNum((char*)pNode->pData) == nInputs );
    }
    if ( !Abc_NtkCheck( pNtkSop ) )
        fprintf( stdout, "Abc_NtkFromPla(): Network check has failed.\n" );
    // perform fast_extract
    Abc_NtkSetDefaultFxParams( p );
    Abc_NtkFastExtract( pNtkSop, p );
    Abc_NtkFxuFreeInfo( p );
    // convert to an AIG
    pNtkAig = Abc_NtkStrash( pNtkSop, 0, 1, 0 );
    Abc_NtkDelete( pNtkSop );
    return pNtkAig;
}